

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O3

void xmlFreeInputStream(xmlParserInputPtr input)

{
  if (input != (xmlParserInputPtr)0x0) {
    if (input->filename != (char *)0x0) {
      (*xmlFree)(input->filename);
    }
    if (input->directory != (char *)0x0) {
      (*xmlFree)(input->directory);
    }
    if (input->encoding != (xmlChar *)0x0) {
      (*xmlFree)(input->encoding);
    }
    if (input->version != (xmlChar *)0x0) {
      (*xmlFree)(input->version);
    }
    if ((input->free != (xmlParserInputDeallocate)0x0) && (input->base != (xmlChar *)0x0)) {
      (*input->free)(input->base);
    }
    if (input->buf != (xmlParserInputBufferPtr)0x0) {
      xmlFreeParserInputBuffer(input->buf);
    }
    (*xmlFree)(input);
    return;
  }
  return;
}

Assistant:

void
xmlFreeInputStream(xmlParserInputPtr input) {
    if (input == NULL) return;

    if (input->filename != NULL) xmlFree((char *) input->filename);
    if (input->directory != NULL) xmlFree((char *) input->directory);
    if (input->encoding != NULL) xmlFree((char *) input->encoding);
    if (input->version != NULL) xmlFree((char *) input->version);
    if ((input->free != NULL) && (input->base != NULL))
        input->free((xmlChar *) input->base);
    if (input->buf != NULL)
        xmlFreeParserInputBuffer(input->buf);
    xmlFree(input);
}